

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadBGFMesh(XMLLoader *this,Ref<embree::XML> *xml)

{
  uint v0;
  uint v1;
  long lVar1;
  ulong uVar2;
  int iVar3;
  SharedState *pSVar4;
  _func_int **pp_Var5;
  size_type sVar6;
  reference pvVar7;
  _Base_ptr in_RDX;
  Node *in_RDI;
  size_t i_2;
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> triangles;
  Ref<embree::SceneGraph::TriangleMeshNode> mesh;
  Ref<embree::SceneGraph::MaterialNode> material;
  size_t matid;
  size_t i_4;
  size_t i_1;
  size_t i_3;
  size_t i;
  value_type *in_stack_fffffffffffffa98;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *in_stack_fffffffffffffaa0;
  vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *in_stack_fffffffffffffaa8;
  vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *in_stack_fffffffffffffab0;
  key_type *in_stack_fffffffffffffab8;
  map<unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
  *in_stack_fffffffffffffac0;
  string *in_stack_fffffffffffffad0;
  XML *in_stack_fffffffffffffad8;
  Token *in_stack_fffffffffffffaf0;
  size_t in_stack_fffffffffffffb28;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffffb30;
  allocator *paVar8;
  TriangleMeshNode *in_stack_fffffffffffffb38;
  BBox1f in_stack_fffffffffffffb40;
  string *in_stack_fffffffffffffb58;
  XML *in_stack_fffffffffffffb60;
  Ref<embree::XML> *xml_00;
  XMLLoader *this_00;
  Node *xml_01;
  undefined4 in_stack_fffffffffffffbf8;
  Triangle local_3cc;
  ulong local_3c0;
  allocator local_3b1;
  string local_3b0 [32];
  long *local_390;
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> local_388;
  allocator local_369;
  string local_368 [24];
  Ref<embree::XML> *in_stack_fffffffffffffcb0;
  XMLLoader *in_stack_fffffffffffffcb8;
  allocator local_321;
  string local_320 [32];
  long *local_300;
  _Rb_tree_node_base local_2f8;
  allocator local_2d1;
  string local_2d0 [32];
  long *local_2b0;
  _Rb_tree_node_base local_2a8;
  undefined1 local_281;
  undefined4 local_280;
  undefined4 local_27c;
  undefined4 local_278;
  undefined4 uStack_274;
  Ref<embree::XML> local_270;
  undefined1 local_268 [40];
  string local_240 [32];
  undefined1 local_220 [40];
  _Base_ptr local_1f8;
  _Base_ptr local_1f0;
  _Base_ptr local_1e8;
  _Base_ptr local_1e0;
  undefined1 *local_1d8;
  _Rb_tree_node_base *local_1c8;
  _Rb_tree_node_base *local_1b8;
  Ref<embree::SceneGraph::Node> local_1a8;
  long **local_198;
  long **local_188;
  undefined1 *local_178;
  long **local_168;
  undefined4 *local_158;
  undefined4 *local_150;
  undefined4 *local_148;
  mapped_type *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  Ref<embree::XML> *local_128;
  Ref<embree::XML> *local_120;
  undefined1 *local_110;
  _func_int **local_100;
  XMLLoader *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  _func_int **local_c0;
  undefined1 *local_b0;
  _Base_ptr local_90;
  _Rb_tree_node_base *local_88;
  _Base_ptr local_70;
  _Rb_tree_node_base *local_68;
  _Rb_tree_node_base *local_50;
  _Rb_tree_node_base *local_20;
  
  local_220._16_8_ = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"materiallist",(allocator *)(local_268 + 0x27));
  XML::child(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  local_1d8 = local_220;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(local_220._0_8_ + 0x98),0);
  iVar3 = Token::Int(in_stack_fffffffffffffaf0);
  pSVar4 = (SharedState *)(long)iVar3;
  xml_01 = (Node *)local_220;
  local_1a8.ptr = xml_01;
  if ((XML *)local_220._0_8_ != (XML *)0x0) {
    (*((RefCount *)local_220._0_8_)->_vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)(local_268 + 0x27));
  local_220._8_8_ = pSVar4;
  local_140 = std::
              map<unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
              ::at(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  local_138 = local_268 + 8;
  local_268._8_8_ = local_140->ptr;
  if ((XML *)local_268._8_8_ != (XML *)0x0) {
    (*(((Node *)&((XML *)local_268._8_8_)->super_RefCount)->super_RefCount)._vptr_RefCount[2])();
  }
  pp_Var5 = (_func_int **)::operator_new(0xd8);
  local_281 = 1;
  local_128 = &local_270;
  local_130 = local_268 + 8;
  local_270.ptr = (XML *)local_268._8_8_;
  if ((XML *)local_268._8_8_ != (XML *)0x0) {
    (*(((Node *)local_268._8_8_)->super_RefCount)._vptr_RefCount[2])();
  }
  local_27c = 0;
  local_280 = 0x3f800000;
  local_148 = &local_278;
  local_150 = &local_27c;
  local_158 = &local_280;
  local_278 = 0;
  uStack_274 = 0x3f800000;
  SceneGraph::TriangleMeshNode::TriangleMeshNode
            (in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb40,
             in_stack_fffffffffffffb28);
  local_281 = 0;
  this_00 = (XMLLoader *)local_268;
  local_100 = pp_Var5;
  local_f8 = this_00;
  if (pp_Var5 != (_func_int **)0x0) {
    lVar1 = *(long *)local_268._0_8_;
    local_268._0_8_ = pp_Var5;
    (**(code **)(lVar1 + 0x10))();
    pp_Var5 = (_func_int **)local_268._0_8_;
  }
  local_268._0_8_ = pp_Var5;
  xml_00 = &local_270;
  local_120 = xml_00;
  if (local_270.ptr != (XML *)0x0) {
    (*(((Node *)&(local_270.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  local_d8 = local_268;
  local_1e0 = (_Base_ptr)local_220._16_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"vertex",&local_2d1);
  XML::childOpt(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  loadVec3faArray(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  std::
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  local_1c8 = &local_2a8;
  for (local_70 = (_Base_ptr)0x0; local_70 < local_2a8._M_parent;
      local_70 = (_Base_ptr)((long)&local_70->_M_color + 1)) {
  }
  local_68 = local_1c8;
  local_50 = local_1c8;
  alignedFree(in_stack_fffffffffffffa98);
  local_2a8._M_right = (_Base_ptr)0x0;
  local_2a8._M_left = (_Base_ptr)0x0;
  local_2a8._M_parent = (_Base_ptr)0x0;
  local_198 = &local_2b0;
  if (local_2b0 != (long *)0x0) {
    (**(code **)(*local_2b0 + 0x18))();
  }
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  local_e0 = local_268;
  local_1e8 = (_Base_ptr)local_220._16_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"normal",&local_321);
  XML::childOpt(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  loadVec3faArray(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  std::
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  local_1b8 = &local_2f8;
  for (local_90 = (_Base_ptr)0x0; local_90 < local_2f8._M_parent;
      local_90 = (_Base_ptr)((long)&local_90->_M_color + 1)) {
  }
  local_88 = local_1b8;
  local_20 = local_1b8;
  alignedFree(in_stack_fffffffffffffa98);
  local_2f8._M_right = (_Base_ptr)0x0;
  local_2f8._M_left = (_Base_ptr)0x0;
  local_2f8._M_parent = (_Base_ptr)0x0;
  local_188 = &local_300;
  if (local_300 != (long *)0x0) {
    (**(code **)(*local_300 + 0x18))();
  }
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  local_1f0 = (_Base_ptr)local_220._16_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"texcoord",&local_369);
  XML::childOpt(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  loadVec2fArray(this_00,xml_00);
  local_e8 = local_268;
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::operator=
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::~vector
            (in_stack_fffffffffffffab0);
  local_178 = &stack0xfffffffffffffcb8;
  if (in_stack_fffffffffffffcb8 != (XMLLoader *)0x0) {
    (**(code **)(*(long *)&(in_stack_fffffffffffffcb8->path).filename + 0x18))();
  }
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  local_1f8 = (_Base_ptr)local_220._16_8_;
  paVar8 = &local_3b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"prim",paVar8);
  XML::childOpt(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  loadVec4iArray((XMLLoader *)CONCAT44(iVar3,in_stack_fffffffffffffbf8),(Ref<embree::XML> *)xml_01);
  local_168 = &local_390;
  if (local_390 != (long *)0x0) {
    (**(code **)(*local_390 + 0x18))();
  }
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  local_3c0 = 0;
  while( true ) {
    uVar2 = local_3c0;
    sVar6 = std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::size(&local_388);
    if (sVar6 <= uVar2) break;
    local_f0 = local_268;
    pvVar7 = std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::operator[]
                       (&local_388,local_3c0);
    v0 = (pvVar7->field_0).field_0.x;
    pvVar7 = std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::operator[]
                       (&local_388,local_3c0);
    v1 = (pvVar7->field_0).field_0.y;
    pvVar7 = std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::operator[]
                       (&local_388,local_3c0);
    SceneGraph::TriangleMeshNode::Triangle::Triangle(&local_3cc,v0,v1,(pvVar7->field_0).field_0.z);
    std::
    vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
    ::push_back(in_stack_fffffffffffffaa0,(value_type *)in_stack_fffffffffffffa98);
    local_3c0 = local_3c0 + 1;
  }
  local_d0 = local_268;
  local_c0 = (_func_int **)local_268._0_8_;
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)local_268._0_8_;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::~vector
            ((vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> *)
             in_stack_fffffffffffffab0);
  local_b0 = local_268;
  if ((_func_int **)local_268._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_268._0_8_ + 0x18))();
  }
  local_110 = local_268 + 8;
  if ((XML *)local_268._8_8_ != (XML *)0x0) {
    (*(((Node *)local_268._8_8_)->super_RefCount)._vptr_RefCount[3])();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadBGFMesh(const Ref<XML>& xml) 
  {
    size_t matid = xml->child("materiallist")->body[0].Int();
    Ref<SceneGraph::MaterialNode> material = id2material.at(matid);
    Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),0);

    mesh->positions.push_back(loadVec3faArray(xml->childOpt("vertex")));
    mesh->normals.push_back(loadVec3faArray(xml->childOpt("normal")));
    mesh->texcoords = loadVec2fArray(xml->childOpt("texcoord"));

    std::vector<Vec4i> triangles = loadVec4iArray(xml->childOpt("prim"));
    for (size_t i=0; i<triangles.size(); i++) 
      mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(triangles[i].x,triangles[i].y,triangles[i].z));

    return mesh.dynamicCast<SceneGraph::Node>();
  }